

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O2

void __thiscall UnifiedRegex::CharBitvec::ClearRange(CharBitvec *this,uint l,uint h)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint h_00;
  
  if (0xff < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x7e,"(l < Size)","l < Size");
    if (!bVar3) goto LAB_00cdb15c;
    *puVar4 = 0;
  }
  if (0xff < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x7f,"(h < Size)","h < Size");
    if (!bVar3) {
LAB_00cdb15c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((h | l) < 0x100) {
    if (l == h) {
      bVar1 = (byte)l & 0x1f;
      this->vec[l >> 5] = this->vec[l >> 5] & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    }
    else if (l < h) {
      uVar6 = l >> 5;
      h_00 = h & 0x1f;
      if (uVar6 == h >> 5) {
        clearrng(this->vec + uVar6,l & 0x1f,h_00);
        return;
      }
      clearrng(this->vec + uVar6,l & 0x1f,0x1f);
      uVar5 = (ulong)(h >> 5);
      uVar7 = (ulong)uVar6;
      while (uVar7 + 1 < uVar5) {
        this->vec[uVar7 + 1] = 0;
        uVar7 = uVar7 + 1;
      }
      uVar6 = 0;
      if (h_00 != 0x1f) {
        uVar6 = -2 << (sbyte)h_00 & this->vec[uVar5];
      }
      this->vec[uVar5] = uVar6;
    }
  }
  return;
}

Assistant:

inline void ClearRange(uint l, uint h)
        {
            Assert(l < Size);
            Assert(h < Size);
            __assume(l < Size);
            __assume(h < Size);
            if (l < Size && h < Size)
            {
                if (l == h)
                {
                    vec[l / wordSize] &= ~(1U << (l % wordSize));
                }
                else if (l < h)
                {
                    int lw = l / wordSize;
                    int hw = h / wordSize;
                    int lo = l % wordSize;
                    int hio = h % wordSize;
                    if (lw == hw)
                    {
                        clearrng(vec[lw], lo, hio);
                    }
                    else
                    {
                        clearrng(vec[lw], lo, wordSize - 1);
                        for (int w = lw + 1; w < hw; w++)
                        {
                            vec[w] = 0;
                        }
                        clearrng(vec[hw], 0, hio);
                    }
                }
            }
        }